

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_Hash,_Eq,_phmap::priv::Alloc<long>_>::
destroy_slots(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_Hash,_Eq,_phmap::priv::Alloc<long>_>
              *this)

{
  bool bVar1;
  allocator_type *paVar2;
  size_t n;
  ctrl_t *pcVar3;
  size_t *psVar4;
  undefined1 local_30 [8];
  Layout layout;
  size_t cnt;
  size_t i;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_Hash,_Eq,_phmap::priv::Alloc<long>_>
  *this_local;
  
  if (this->capacity_ != 0) {
    cnt = 0;
    layout.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1] = this->capacity_;
    for (; cnt != layout.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1]; cnt = cnt + 1)
    {
      bVar1 = IsFull(this->ctrl_[cnt]);
      if (bVar1) {
        paVar2 = alloc_ref(this);
        hash_policy_traits<phmap::priv::(anonymous_namespace)::IntPolicy,void>::
        destroy<phmap::priv::Alloc<long>>(paVar2,this->slots_ + cnt);
      }
    }
    _local_30 = (size_t  [2])MakeLayout(this->capacity_);
    SanitizerUnpoisonMemoryRegion(this->slots_,this->capacity_ << 3);
    paVar2 = alloc_ref(this);
    pcVar3 = this->ctrl_;
    n = internal_layout::
        LayoutImpl<std::tuple<signed_char,_long>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
        ::AllocSize((LayoutImpl<std::tuple<signed_char,_long>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     *)local_30);
    Deallocate<8ul,phmap::priv::Alloc<long>>(paVar2,pcVar3,n);
    pcVar3 = EmptyGroup<std::is_same<phmap::priv::Alloc<long>,std::allocator<long>>>();
    this->ctrl_ = pcVar3;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
    psVar4 = growth_left(this);
    *psVar4 = 0;
  }
  return;
}

Assistant:

void destroy_slots() {
        if (!capacity_)
            return;
        
        PHMAP_IF_CONSTEXPR((!std::is_trivially_destructible<typename PolicyTraits::value_type>::value ||
                            std::is_same<typename Policy::is_flat, std::false_type>::value)) {
            // node map, or not trivially destructible... we  need to iterate and destroy values one by one
            // std::cout << "either this is a node map or " << type_name<typename PolicyTraits::value_type>()  << " is not trivially_destructible\n";
            for (size_t i = 0, cnt = capacity_; i != cnt; ++i) {
                if (IsFull(ctrl_[i])) {
                    PolicyTraits::destroy(&alloc_ref(), slots_ + i);
                }
            }
        } 
        auto layout = MakeLayout(capacity_);
        // Unpoison before returning the memory to the allocator.
        SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
        Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
        ctrl_ = EmptyGroup<std_alloc_t>();
        slots_ = nullptr;
        size_ = 0;
        capacity_ = 0;
        growth_left() = 0;
    }